

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Logging.cpp
# Opt level: O0

void __thiscall
RenX_LoggingPlugin::RenX_OnSteal
          (RenX_LoggingPlugin *this,Server *server,PlayerInfo *player,string_view vehicle,
          PlayerInfo *victim)

{
  bool bVar1;
  __sv_type _Var2;
  undefined1 auVar3 [16];
  code *local_e8;
  size_t local_b8;
  char *local_b0;
  size_t local_88;
  char *local_80;
  undefined1 local_68 [8];
  string msg;
  logFuncType func;
  PlayerInfo *victim_local;
  PlayerInfo *player_local;
  Server *server_local;
  RenX_LoggingPlugin *this_local;
  string_view vehicle_local;
  
  if ((*(ulong *)&this->field_0xa0 >> 0x34 & 1) == 0) {
    msg.field_2._8_8_ = RenX::Server::sendAdmChan;
  }
  else {
    msg.field_2._8_8_ = RenX::Server::sendLogChan;
  }
  std::__cxx11::string::string((string *)local_68,&this->stealFmt);
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
  if (!bVar1) {
    RenX::processTags((string *)local_68,server,player,victim,(BuildingInfo *)0x0);
    _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view
                      ((string *)(RenX::tags + 0x14e8));
    auVar3 = RenX::translateName(vehicle._M_len,vehicle._M_str);
    local_88 = _Var2._M_len;
    local_80 = _Var2._M_str;
    RenX::replace_tag(local_68,local_88,local_80,auVar3._0_8_,auVar3._8_8_);
    if ((msg.field_2._8_8_ & 1) == 0) {
      local_e8 = (code *)msg.field_2._8_8_;
    }
    else {
      local_e8 = *(code **)(*(long *)server + msg.field_2._8_8_ + -1);
    }
    _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_68);
    local_b8 = _Var2._M_len;
    local_b0 = _Var2._M_str;
    (*local_e8)(server,local_b8,local_b0);
  }
  std::__cxx11::string::~string((string *)local_68);
  return;
}

Assistant:

void RenX_LoggingPlugin::RenX_OnSteal(RenX::Server &server, const RenX::PlayerInfo &player, std::string_view vehicle, const RenX::PlayerInfo &victim)
{
	logFuncType func;
	if (RenX_LoggingPlugin::stealPublic)
		func = &RenX::Server::sendLogChan;
	else
		func = &RenX::Server::sendAdmChan;

	std::string msg = this->stealFmt;
	if (!msg.empty())
	{
		RenX::processTags(msg, &server, &player, &victim);
		RenX::replace_tag(msg, RenX::tags->INTERNAL_OBJECT_TAG, RenX::translateName(vehicle));
		(server.*func)(msg);
	}
}